

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duckdb_functions.cpp
# Opt level: O2

vector<duckdb::Value,_true> *
duckdb::AggregateFunctionExtractor::GetParameters
          (vector<duckdb::Value,_true> *__return_storage_ptr__,AggregateFunctionCatalogEntry *entry,
          idx_t offset)

{
  long lVar1;
  ulong __val;
  string local_180;
  AggregateFunction local_160;
  
  (__return_storage_ptr__->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (__return_storage_ptr__->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  __val = 0;
  while( true ) {
    FunctionSet<duckdb::AggregateFunction>::GetFunctionByOffset
              (&local_160,&(entry->functions).super_FunctionSet<duckdb::AggregateFunction>,offset);
    lVar1 = (long)local_160.super_BaseScalarFunction.super_SimpleFunction.arguments.
                  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)local_160.super_BaseScalarFunction.super_SimpleFunction.arguments.
                  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                  _M_impl.super__Vector_impl_data._M_start;
    AggregateFunction::~AggregateFunction(&local_160);
    if ((ulong)(lVar1 / 0x18) <= __val) break;
    ::std::__cxx11::to_string(&local_180,__val);
    ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_160
                     ,"col",&local_180);
    ::std::vector<duckdb::Value,std::allocator<duckdb::Value>>::emplace_back<std::__cxx11::string>
              ((vector<duckdb::Value,std::allocator<duckdb::Value>> *)__return_storage_ptr__,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_160);
    ::std::__cxx11::string::~string((string *)&local_160);
    ::std::__cxx11::string::~string((string *)&local_180);
    __val = __val + 1;
  }
  return __return_storage_ptr__;
}

Assistant:

static vector<Value> GetParameters(AggregateFunctionCatalogEntry &entry, idx_t offset) {
		vector<Value> results;
		for (idx_t i = 0; i < entry.functions.GetFunctionByOffset(offset).arguments.size(); i++) {
			results.emplace_back("col" + to_string(i));
		}
		return results;
	}